

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolIndexSearch.h
# Opt level: O0

string * __thiscall
SymbolIndexSearch::operator()[abi_cxx11_
          (string *__return_storage_ptr__,SymbolIndexSearch *this,Token *token)

{
  string_view subtoken;
  string_view subtoken_00;
  string_view subtoken_01;
  undefined8 uVar1;
  size_t sVar2;
  bool bVar3;
  Page *pPVar4;
  size_type sVar5;
  string *psVar6;
  reference pvVar7;
  basic_string_view<char,_std::char_traits<char>_> *pbVar8;
  allocator<char> local_292;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  undefined4 local_268;
  allocator<char> local_262;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  size_t local_218;
  char *pcStack_210;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_200;
  char *local_1f0;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  size_t local_198;
  char *pcStack_190;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_180;
  char *local_170;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  size_t local_118;
  char *pcStack_110;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_108;
  char *local_f8;
  undefined1 local_f0 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  size_t i;
  string local_c8;
  Page *local_a8;
  Page *page;
  size_t start_parenthesis;
  size_t start_template;
  string_view *v;
  iterator __end1;
  iterator __begin1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  string_view local_60;
  undefined1 local_50 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  subtokens;
  allocator<char> local_21;
  Token *local_20;
  Token *token_local;
  SymbolIndexSearch *this_local;
  
  local_20 = token;
  token_local = (Token *)this;
  this_local = (SymbolIndexSearch *)__return_storage_ptr__;
  if (token->type == std) {
    local_60 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)token);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range1,"::");
    ::str::split((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_50,local_60,___range1);
    __end1 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_50);
    v = (string_view *)
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)local_50);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  *)&v);
      if (!bVar3) break;
      start_template =
           (size_t)__gnu_cxx::
                   __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ::operator*(&__end1);
      start_parenthesis =
           std::basic_string_view<char,_std::char_traits<char>_>::find
                     ((basic_string_view<char,_std::char_traits<char>_> *)start_template,'<',0);
      sVar2 = start_template;
      if (start_parenthesis != 0xffffffffffffffff) {
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)start_template);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  ((basic_string_view<char,_std::char_traits<char>_> *)sVar2,
                   sVar5 - start_parenthesis);
      }
      page = (Page *)std::basic_string_view<char,_std::char_traits<char>_>::find
                               ((basic_string_view<char,_std::char_traits<char>_> *)start_template,
                                '(',0);
      sVar2 = start_template;
      if (page != (Page *)0xffffffffffffffff) {
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)start_template);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  ((basic_string_view<char,_std::char_traits<char>_> *)sVar2,sVar5 - (long)page);
      }
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"/w/cpp/symbol_index",(allocator<char> *)((long)&i + 7));
    pPVar4 = SearchBase::getPage(&this->super_SearchBase,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
    link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = true;
    link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _17_7_ = 0;
    local_a8 = pPVar4;
    while( true ) {
      uVar1 = link.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _16_8_;
      sVar5 = std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_50);
      if (sVar5 <= (ulong)uVar1) break;
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_f0);
      bVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                        ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         local_f0);
      if (!bVar3) {
        psVar6 = &local_a8->content;
        pvVar7 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_50,
                              link.
                              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ._16_8_);
        local_118 = pvVar7->_M_len;
        pcStack_110 = pvVar7->_M_str;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"<span>",&local_139)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"</span>",&local_161);
        subtoken_01._M_str = pcStack_110;
        subtoken_01._M_len = local_118;
        SearchBase::findLinkToSubtoken
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_108._M_value,&this->super_SearchBase,psVar6,subtoken_01,&local_138,
                   &local_160);
        local_f0 = (undefined1  [8])local_108._M_value._M_len;
        link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len = (size_t)local_108._M_value._M_str;
        link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = local_f8;
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
      }
      bVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                        ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         local_f0);
      if (!bVar3) {
        psVar6 = &local_a8->content;
        pvVar7 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_50,
                              link.
                              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ._16_8_);
        local_198 = pvVar7->_M_len;
        pcStack_190 = pvVar7->_M_str;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"<code>",&local_1b9)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,"</code>",&local_1e1);
        subtoken_00._M_str = pcStack_190;
        subtoken_00._M_len = local_198;
        SearchBase::findLinkToSubtoken
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_180._M_value,&this->super_SearchBase,psVar6,subtoken_00,&local_1b8,
                   &local_1e0);
        local_f0 = (undefined1  [8])local_180._M_value._M_len;
        link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len = (size_t)local_180._M_value._M_str;
        link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = local_170;
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      bVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                        ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         local_f0);
      if (!bVar3) {
        psVar6 = &local_a8->content;
        pvVar7 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_50,
                              link.
                              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ._16_8_);
        local_218 = pvVar7->_M_len;
        pcStack_210 = pvVar7->_M_str;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"<tt>",&local_239);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"</tt>",&local_261);
        subtoken._M_str = pcStack_210;
        subtoken._M_len = local_218;
        SearchBase::findLinkToSubtoken
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_200._M_value,&this->super_SearchBase,psVar6,subtoken,&local_238,&local_260
                  );
        local_f0 = (undefined1  [8])local_200._M_value._M_len;
        link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len = (size_t)local_200._M_value._M_str;
        link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = local_1f0;
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_239);
      }
      bVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                        ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         local_f0);
      uVar1 = link.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _16_8_;
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_262);
        std::allocator<char>::~allocator((allocator<char> *)&local_262);
        goto LAB_00273c7e;
      }
      sVar5 = std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_50);
      if (uVar1 == sVar5 - 1) {
        pbVar8 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::value
                           ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)__return_storage_ptr__,
                   (basic_string_view<char,_std::char_traits<char>_> *)pbVar8,&local_269);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
        goto LAB_00273c7e;
      }
      pbVar8 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::value
                         ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          local_f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_290,(basic_string_view<char,_std::char_traits<char>_> *)pbVar8,
                 &local_291);
      local_a8 = SearchBase::getPage(&this->super_SearchBase,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
      link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           link.
           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
           _16_8_ + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_292);
    std::allocator<char>::~allocator((allocator<char> *)&local_292);
LAB_00273c7e:
    local_268 = 1;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)local_50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
		if (token.type != Token::Type::std) {
			return "";
		}

		std::vector<std::string_view> subtokens = str::split(token.content, "::");
		for (std::string_view& v : subtokens) {
			const size_t start_template = v.find('<');
			if (start_template != std::string_view::npos) {
				v.remove_suffix(v.size() - start_template);
			}

			const size_t start_parenthesis = v.find('(');
			if (start_parenthesis != std::string_view::npos) {
				v.remove_suffix(v.size() - start_parenthesis);
			}
		}

		Page* page = getPage("/w/cpp/symbol_index");
		for (size_t i = 1; i < subtokens.size(); i++) {
			std::optional<std::string_view> link;

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<span>", "</span>");
			}

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<code>", "</code>");
			}

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<tt>", "</tt>");
			}

			if (!link.has_value()) {
				return "";
			}


			if (i == subtokens.size() - 1) {
				return std::string(link.value());
			}

			page = getPage(std::string(link.value()));
		}

		return "";
	}